

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system.cxx
# Opt level: O2

bool __thiscall xray_re::xr_file_system::folder_exist(xr_file_system *this,char *path,char *name)

{
  bool bVar1;
  path_alias *ppVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  ppVar2 = find_path_alias(this,path);
  if (ppVar2 == (path_alias *)0x0) {
    bVar1 = false;
  }
  else {
    std::operator+(&local_30,&ppVar2->root,name);
    bVar1 = folder_exist(local_30._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return bVar1;
}

Assistant:

bool xr_file_system::folder_exist(const char* path, const char* name) const
{
	const path_alias* pa = find_path_alias(path);
	return pa ? folder_exist(pa->root + name) : false;
}